

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void cm_expat_XML_ParserFree(XML_Parser parser)

{
  long lVar1;
  TAG *p;
  XML_Parser parser_local;
  
  do {
    if (*(long *)((long)parser + 0x3d0) == 0) {
      if (*(long *)((long)parser + 0x3d8) == 0) {
        destroyBindings(*(BINDING **)((long)parser + 1000),parser);
        destroyBindings(*(BINDING **)((long)parser + 0x3e0),parser);
        poolDestroy((STRING_POOL *)((long)parser + 0x418));
        poolDestroy((STRING_POOL *)((long)parser + 0x448));
        if (*(long *)((long)parser + 0x490) != 0) {
          if (*(int *)((long)parser + 0x484) != 0) {
            *(undefined4 *)((long)parser + 0x360) = 0;
          }
          dtdSwap((DTD *)((long)parser + 0x290),(DTD *)(*(long *)((long)parser + 0x490) + 0x290));
        }
        dtdDestroy((DTD *)((long)parser + 0x290),parser);
        (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser + 0x400));
        if (*(long *)((long)parser + 0x478) != 0) {
          (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser + 0x478));
        }
        if (*(long *)((long)parser + 0x10) != 0) {
          (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser + 0x10));
        }
        (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser + 0x58));
        if (*(long *)((long)parser + 0x1d0) != 0) {
          (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser + 0x1d0));
        }
        if (*(long *)((long)parser + 0x1e8) != 0) {
          (**(code **)((long)parser + 0x1e8))(*(undefined8 *)((long)parser + 0x1d8));
        }
        (**(code **)((long)parser + 0x28))(parser);
        return;
      }
      *(undefined8 *)((long)parser + 0x3d0) = *(undefined8 *)((long)parser + 0x3d8);
      *(undefined8 *)((long)parser + 0x3d8) = 0;
    }
    lVar1 = *(long *)((long)parser + 0x3d0);
    *(undefined8 *)((long)parser + 0x3d0) = **(undefined8 **)((long)parser + 0x3d0);
    (**(code **)((long)parser + 0x28))(*(undefined8 *)(lVar1 + 0x30));
    destroyBindings(*(BINDING **)(lVar1 + 0x40),parser);
    (**(code **)((long)parser + 0x28))(lVar1);
  } while( true );
}

Assistant:

void XML_ParserFree(XML_Parser parser)
{
  for (;;) {
    TAG *p;
    if (tagStack == 0) {
      if (freeTagList == 0)
        break;
      tagStack = freeTagList;
      freeTagList = 0;
    }
    p = tagStack;
    tagStack = tagStack->parent;
    FREE(p->buf);
    destroyBindings(p->bindings, parser);
    FREE(p);
  }
  destroyBindings(freeBindingList, parser);
  destroyBindings(inheritedBindings, parser);
  poolDestroy(&tempPool);
  poolDestroy(&temp2Pool);
#ifdef XML_DTD
  if (parentParser) {
    if (hadExternalDoctype)
      dtd.complete = 0;
    dtdSwap(&dtd, &((Parser *)parentParser)->m_dtd);
  }
#endif /* XML_DTD */
  dtdDestroy(&dtd, parser);
  FREE((void *)atts);
  if (groupConnector)
    FREE(groupConnector);
  if (buffer)
    FREE(buffer);
  FREE(dataBuf);
  if (unknownEncodingMem)
    FREE(unknownEncodingMem);
  if (unknownEncodingRelease)
    unknownEncodingRelease(unknownEncodingData);
  FREE(parser);
}